

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::NeedBailOnImplicitCallForLiveValues(GlobOpt *this,BasicBlock *block,bool isForwardPass)

{
  ValueSet *pVVar1;
  code *pcVar2;
  undefined4 *puVar3;
  undefined7 in_register_00000011;
  bool bVar4;
  
  if ((int)CONCAT71(in_register_00000011,isForwardPass) == 0) {
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(block->noImplicitCallUses);
    if (!bVar4) {
      return true;
    }
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(block->noImplicitCallNoMissingValuesUses);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3463,"(block->noImplicitCallNoMissingValuesUses->IsEmpty())",
                         "block->noImplicitCallNoMissingValuesUses->IsEmpty()");
      if (!bVar4) goto LAB_0043fea1;
      *puVar3 = 0;
    }
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(block->noImplicitCallNativeArrayUses);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3464,"(block->noImplicitCallNativeArrayUses->IsEmpty())",
                         "block->noImplicitCallNativeArrayUses->IsEmpty()");
      if (!bVar4) goto LAB_0043fea1;
      *puVar3 = 0;
    }
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      (block->noImplicitCallJsArrayHeadSegmentSymUses);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3465,"(block->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty())",
                         "block->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty()");
      if (!bVar4) goto LAB_0043fea1;
      *puVar3 = 0;
    }
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(block->noImplicitCallArrayLengthSymUses);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3466,"(block->noImplicitCallArrayLengthSymUses->IsEmpty())",
                         "block->noImplicitCallArrayLengthSymUses->IsEmpty()");
      if (!bVar4) {
LAB_0043fea1:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar3 = 0;
    }
    bVar4 = false;
  }
  else {
    pVVar1 = (block->globOptData).valuesToKillOnCalls;
    bVar4 = (pVVar1->
            super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ).count !=
            (pVVar1->
            super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ).freeCount;
  }
  return bVar4;
}

Assistant:

bool
GlobOpt::NeedBailOnImplicitCallForLiveValues(BasicBlock const * const block, const bool isForwardPass) const
{
    if(isForwardPass)
    {
        return block->globOptData.valuesToKillOnCalls->Count() != 0;
    }

    if(block->noImplicitCallUses->IsEmpty())
    {
        Assert(block->noImplicitCallNoMissingValuesUses->IsEmpty());
        Assert(block->noImplicitCallNativeArrayUses->IsEmpty());
        Assert(block->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty());
        Assert(block->noImplicitCallArrayLengthSymUses->IsEmpty());
        return false;
    }

    return true;
}